

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O2

Result * __thiscall Catch::Clara::Detail::ParserBase::validate(ParserBase *this)

{
  Result *in_RDI;
  
  (in_RDI->super_ResultValueBase<void>).super_ResultBase.m_type = Ok;
  (in_RDI->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_001a75e0;
  (in_RDI->m_errorMessage)._M_dataplus._M_p = (pointer)&(in_RDI->m_errorMessage).field_2;
  (in_RDI->m_errorMessage)._M_string_length = 0;
  (in_RDI->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

virtual auto validate() const -> Result { return Result::ok(); }